

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

void __thiscall
Imath_3_2::Matrix33<float>::getValue<float>(Matrix33<float> *this,Matrix33<float> *v)

{
  Matrix33<float> *v_local;
  Matrix33<float> *this_local;
  
  v->x[0][0] = this->x[0][0];
  v->x[0][1] = this->x[0][1];
  v->x[0][2] = this->x[0][2];
  v->x[1][0] = this->x[1][0];
  v->x[1][1] = this->x[1][1];
  v->x[1][2] = this->x[1][2];
  v->x[2][0] = this->x[2][0];
  v->x[2][1] = this->x[2][1];
  v->x[2][2] = this->x[2][2];
  return;
}

Assistant:

IMATH_HOSTDEVICE inline void
Matrix33<T>::getValue (Matrix33<S>& v) const IMATH_NOEXCEPT
{
    v.x[0][0] = x[0][0];
    v.x[0][1] = x[0][1];
    v.x[0][2] = x[0][2];
    v.x[1][0] = x[1][0];
    v.x[1][1] = x[1][1];
    v.x[1][2] = x[1][2];
    v.x[2][0] = x[2][0];
    v.x[2][1] = x[2][1];
    v.x[2][2] = x[2][2];
}